

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

Matrix44<double> * Imath_3_2::outerProduct<double>(Vec4<double> *a,Vec4<double> *b)

{
  double *in_RDX;
  double *in_RSI;
  Matrix44<double> *in_RDI;
  
  Matrix44<double>::Matrix44
            (in_RDI,*in_RSI * *in_RDX,*in_RSI * in_RDX[1],*in_RSI * in_RDX[2],*in_RSI * in_RDX[3],
             in_RSI[1] * *in_RDX,in_RSI[1] * in_RDX[1],in_RSI[1] * in_RDX[2],*in_RSI * in_RDX[3],
             in_RSI[2] * *in_RDX,in_RSI[2] * in_RDX[1],in_RSI[2] * in_RDX[2],*in_RSI * in_RDX[3],
             in_RSI[3] * *in_RDX,in_RSI[3] * in_RDX[1],in_RSI[3] * in_RDX[2],in_RSI[3] * in_RDX[3]);
  return in_RDI;
}

Assistant:

Matrix44<T>
outerProduct (const Vec4<T>& a, const Vec4<T>& b)
{
    return Matrix44<T> (
        a.x * b.x,
        a.x * b.y,
        a.x * b.z,
        a.x * b.w,
        a.y * b.x,
        a.y * b.y,
        a.y * b.z,
        a.x * b.w,
        a.z * b.x,
        a.z * b.y,
        a.z * b.z,
        a.x * b.w,
        a.w * b.x,
        a.w * b.y,
        a.w * b.z,
        a.w * b.w);
}